

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

void __thiscall indigox::Atom::SetElement(Atom *this,Int e)

{
  shared_ptr<indigox::Element> *in_RDI;
  PeriodicTable_p PT;
  shared_ptr<indigox::Element> *in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffd7;
  PeriodicTable *in_stack_ffffffffffffffd8;
  
  PeriodicTable::GetInstance();
  std::__shared_ptr_access<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x10b5f0);
  PeriodicTable::GetElement(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7);
  std::shared_ptr<indigox::Element>::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x10b621);
  std::shared_ptr<indigox::PeriodicTable>::~shared_ptr
            ((shared_ptr<indigox::PeriodicTable> *)0x10b62b);
  return;
}

Assistant:

void Atom::SetElement(Int e) {
    PeriodicTable_p PT = PeriodicTable::GetInstance();
    element_ = PT->GetElement((uint8_t)e);
  }